

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
* __thiscall
kratos::Port::connected_to
          (unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
           *__return_storage_ptr__,Port *this)

{
  _Hash_node_base *p_Var1;
  undefined8 *puVar2;
  undefined1 local_c0 [8];
  PortVisitor v;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if ((this->direction_ != In) &&
     (p_Var1 = (this->super_Var).sinks_._M_h._M_before_begin._M_nxt,
     p_Var1 != (_Hash_node_base *)0x0)) {
    v.ports._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002cf518;
    do {
      v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
      v.super_IRVisitor._8_8_ = &v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      local_c0 = (undefined1  [8])&PTR_visit_root_002cb200;
      v.super_IRVisitor.visited_._M_h._M_single_bucket =
           (__node_base_ptr)&v.ports._M_h._M_rehash_policy._M_next_resize;
      v.ports._M_h._M_buckets = (__buckets_ptr)0x1;
      v.ports._M_h._M_bucket_count = 0;
      v.ports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      v.ports._M_h._M_element_count._0_4_ = 0x3f800000;
      v.ports._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      v.ports._M_h._M_rehash_policy._4_4_ = 0;
      v.ports._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root((IRVisitor *)local_c0,(IRNode *)p_Var1[1]._M_nxt[0x18]._M_nxt);
      for (puVar2 = (undefined8 *)v.ports._M_h._M_bucket_count; puVar2 != (undefined8 *)0x0;
          puVar2 = (undefined8 *)*puVar2) {
        if ((*(int *)(puVar2[1] + 0x270) == 0) &&
           (*(Generator **)(puVar2[1] + 0x200) != (this->super_Var).generator_)) {
          std::
          _Hashtable<std::shared_ptr<kratos::Port>,std::shared_ptr<kratos::Port>,std::allocator<std::shared_ptr<kratos::Port>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Port>>,std::hash<std::shared_ptr<kratos::Port>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<std::shared_ptr<kratos::Port>const&>
                    ((_Hashtable<std::shared_ptr<kratos::Port>,std::shared_ptr<kratos::Port>,std::allocator<std::shared_ptr<kratos::Port>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Port>>,std::hash<std::shared_ptr<kratos::Port>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)__return_storage_ptr__,puVar2 + 1);
        }
      }
      local_c0 = (undefined1  [8])&PTR_visit_root_002cb200;
      std::
      _Hashtable<std::shared_ptr<kratos::Port>,_std::shared_ptr<kratos::Port>,_std::allocator<std::shared_ptr<kratos::Port>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Port>,_std::shared_ptr<kratos::Port>,_std::allocator<std::shared_ptr<kratos::Port>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&v.super_IRVisitor.visited_._M_h._M_single_bucket);
      local_c0 = (undefined1  [8])v.ports._M_h._M_single_bucket;
      std::
      _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&v.super_IRVisitor.level);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<std::shared_ptr<Port>> Port::connected_to() const {
    std::unordered_set<std::shared_ptr<Port>> result;
    if (direction_ == PortDirection::In) return result;
    for (auto const& stmt : sinks_) {
        auto* const sinks = stmt->left();
        PortVisitor v;
        v.visit_root(sinks);
        auto const& ports = v.ports;
        for (auto const& p : ports) {
            if (p->direction_ == PortDirection::In && p->generator_ != generator_) {
                result.emplace(p);
            }
        }
    }
    return result;
}